

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mat_meat.hpp
# Opt level: O2

void __thiscall
arma::Mat<double>::
Mat<arma::eGlue<arma::Mat<double>,arma::Mat<double>,arma::eglue_minus>,arma::eop_scalar_div_post>
          (Mat<double> *this,
          eOp<arma::eGlue<arma::Mat<double>,_arma::Mat<double>,_arma::eglue_minus>,_arma::eop_scalar_div_post>
          *X)

{
  Mat<double> *pMVar1;
  uword uVar2;
  
  pMVar1 = (((X->P).Q)->P1).Q;
  uVar2 = pMVar1->n_cols;
  this->n_rows = pMVar1->n_rows;
  this->n_cols = uVar2;
  this->n_elem = pMVar1->n_elem;
  this->mem = (double *)0x0;
  this->n_alloc = 0;
  this->vec_state = 0;
  this->mem_state = 0;
  init_cold(this);
  eop_core<arma::eop_scalar_div_post>::
  apply<arma::Mat<double>,arma::eGlue<arma::Mat<double>,arma::Mat<double>,arma::eglue_minus>>
            (this,X);
  return;
}

Assistant:

inline
Mat<eT>::Mat(const eOp<T1, eop_type>& X)
  : n_rows(X.get_n_rows())
  , n_cols(X.get_n_cols())
  , n_elem(X.get_n_elem())
  , n_alloc()
  , vec_state(0)
  , mem_state(0)
  , mem()
  {
  arma_debug_sigprint_this(this);
  
  arma_type_check(( is_same_type< eT, typename T1::elem_type >::no ));
  
  init_cold();
  
  eop_type::apply(*this, X);
  }